

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Performance::LoopCase::init(LoopCase *this,EVP_PKEY_CTX *ctx)

{
  PerfCaseType PVar1;
  DecisionType DVar2;
  pointer pfVar3;
  int iVar4;
  ostream *poVar5;
  ostringstream *stream;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  AttribSpec *__args;
  char *pcVar11;
  float fVar12;
  ostringstream vtx;
  ostringstream frag;
  Vec4 local_3c8;
  Vec4 local_3b8;
  Vec4 local_3a8;
  Vec4 local_398;
  AttribSpec local_380;
  ostringstream local_320 [376];
  ostringstream local_1a8 [376];
  
  PVar1 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  DVar2 = this->m_decisionType;
  pcVar6 = "u_bound";
  if (DVar2 == DECISION_STATIC) {
    pcVar6 = "10.5";
  }
  pcVar9 = "loopBound";
  if ((this->m_isLoopBoundStable & 1U) != 0) {
    pcVar9 = "v_bound";
  }
  pcVar11 = "a_bound";
  if (PVar1 != CASETYPE_VERTEX) {
    pcVar11 = pcVar9;
  }
  if (DVar2 < DECISION_ATTRIBUTE) {
    pcVar11 = pcVar6;
  }
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  stream = local_1a8;
  if (PVar1 == CASETYPE_VERTEX) {
    stream = local_320;
  }
  std::operator<<((ostream *)local_320,"attribute highp vec4 a_position;\n");
  std::operator<<((ostream *)local_320,"attribute mediump vec4 a_value;\n");
  if (DVar2 - DECISION_UNIFORM < 2) {
    pcVar6 = "uniform mediump float u_bound;\n";
    poVar5 = (ostream *)stream;
    if (DVar2 == DECISION_ATTRIBUTE) {
      pcVar6 = "attribute mediump float a_bound;\n";
      poVar5 = (ostream *)local_320;
    }
    std::operator<<(poVar5,pcVar6);
  }
  if (PVar1 == CASETYPE_VERTEX) {
    pcVar6 = "varying mediump vec4 v_color;\n";
    std::operator<<((ostream *)local_320,"varying mediump vec4 v_color;\n");
LAB_003e509c:
    std::operator<<((ostream *)local_1a8,pcVar6);
  }
  else {
    std::operator<<((ostream *)local_320,"varying mediump vec4 v_value;\n");
    std::operator<<((ostream *)local_1a8,"varying mediump vec4 v_value;\n");
    if (DVar2 == DECISION_ATTRIBUTE) {
      pcVar6 = "varying mediump float v_bound;\n";
      std::operator<<((ostream *)local_320,"varying mediump float v_bound;\n");
      goto LAB_003e509c;
    }
  }
  std::operator<<((ostream *)local_320,"\n");
  std::operator<<((ostream *)local_320,"void main()\n");
  std::operator<<((ostream *)local_320,"{\n");
  std::operator<<((ostream *)local_320,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_1a8,"\n");
  std::operator<<((ostream *)local_1a8,"void main()\n");
  std::operator<<((ostream *)local_1a8,"{\n");
  std::operator<<((ostream *)stream,"\tmediump vec4 res = vec4(0.0);\n");
  if (PVar1 != CASETYPE_VERTEX && this->m_isLoopBoundStable == false) {
    poVar5 = std::operator<<((ostream *)local_1a8,
                             "\tmediump float loopBound = fract(v_bound) < 0.5 ? ");
    poVar5 = std::operator<<(poVar5,"5.5");
    poVar5 = std::operator<<(poVar5," : ");
    poVar5 = std::operator<<(poVar5,"15.5");
    std::operator<<(poVar5,";\n");
  }
  if (this->m_type == LOOP_FOR) {
    poVar5 = std::operator<<((ostream *)stream,"\tfor (mediump float i = 0.0; i < ");
    poVar5 = std::operator<<(poVar5,pcVar11);
    pcVar6 = "; i++)\n";
  }
  else {
    std::operator<<((ostream *)stream,"\tmediump float i = 0.0;\n");
    if (this->m_type == LOOP_WHILE) {
      poVar5 = std::operator<<((ostream *)stream,"\twhile (i < ");
      poVar5 = std::operator<<(poVar5,pcVar11);
      pcVar6 = ")\n";
    }
    else {
      pcVar6 = "\tdo\n";
      poVar5 = (ostream *)stream;
    }
  }
  std::operator<<(poVar5,pcVar6);
  std::operator<<((ostream *)stream,"\t{\n");
  std::operator<<((ostream *)stream,"\t\t");
  pcVar6 = "v_value";
  if (PVar1 == CASETYPE_VERTEX) {
    pcVar6 = "a_value";
  }
  writeLoopWorkload((ostringstream *)stream,"res",pcVar6);
  std::operator<<((ostream *)stream,"\n");
  pcVar6 = "\t}\n";
  if ((this->m_type != LOOP_FOR) &&
     (std::operator<<((ostream *)stream,"\t\ti++;\n"), this->m_type == LOOP_DO_WHILE)) {
    poVar5 = std::operator<<((ostream *)stream,"\t} while (i < ");
    stream = (ostringstream *)std::operator<<(poVar5,pcVar11);
    pcVar6 = ");\n";
  }
  std::operator<<((ostream *)stream,pcVar6);
  if (PVar1 == CASETYPE_VERTEX) {
    std::operator<<((ostream *)local_320,"\tv_color = res;\n");
    pcVar6 = "\tgl_FragColor = v_color;\n";
  }
  else {
    if (DVar2 == DECISION_ATTRIBUTE) {
      std::operator<<((ostream *)local_320,"\tv_bound = a_bound;\n");
    }
    std::operator<<((ostream *)local_320,"\tv_value = a_value;\n");
    pcVar6 = "\tgl_FragColor = res;\n";
  }
  std::operator<<((ostream *)local_1a8,pcVar6);
  std::operator<<((ostream *)local_320,"}\n");
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  if (DVar2 == DECISION_ATTRIBUTE) {
    if (this->m_isLoopBoundStable == true) {
      local_398.m_data[0] = 10.5;
      local_398.m_data[1] = 0.0;
      local_398.m_data[2] = 0.0;
      local_398.m_data[3] = 0.0;
      local_3a8.m_data[0] = 10.5;
      local_3a8.m_data[1] = 0.0;
      local_3a8.m_data[2] = 0.0;
      local_3a8.m_data[3] = 0.0;
      local_3b8.m_data[0] = 10.5;
      local_3b8.m_data[1] = 0.0;
      local_3b8.m_data[2] = 0.0;
      local_3b8.m_data[3] = 0.0;
      local_3c8.m_data[0] = 10.5;
      local_3c8.m_data[1] = 0.0;
      local_3c8.m_data[2] = 0.0;
      local_3c8.m_data[3] = 0.0;
      deqp::gls::AttribSpec::AttribSpec
                (&local_380,"a_bound",&local_398,&local_3a8,&local_3b8,&local_3c8);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_380);
    }
    else {
      if (PVar1 == CASETYPE_VERTEX) {
        std::vector<float,_std::allocator<float>_>::resize
                  (&this->m_boundArray,
                   (long)(((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer
                           .m_gridSizeX * 4 + 4) *
                         ((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                          m_gridSizeY + 1)));
        pfVar3 = (this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)((long)(this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) >> 2;
        uVar10 = 0;
        uVar8 = uVar7 & 0xffffffff;
        if ((int)uVar7 < 1) {
          uVar8 = uVar10;
        }
        for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          fVar12 = 0.0;
          if ((uVar10 & 3) == 0) {
            fVar12 = *(float *)(&DAT_005d38bc + (ulong)((uVar10 & 4) == 0) * 4);
          }
          pfVar3[uVar10] = fVar12;
        }
        goto LAB_003e5489;
      }
      local_3c8.m_data[0] =
           (float)(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_measurer.
                  m_viewportWidth * 0.5;
      local_3a8.m_data[1] = 0.0;
      local_3a8.m_data[2] = 0.0;
      local_3a8.m_data[3] = 0.0;
      local_398.m_data[0] = 0.0;
      local_398.m_data[1] = 0.0;
      local_398.m_data[2] = 0.0;
      local_398.m_data[3] = 0.0;
      local_3c8.m_data[1] = 0.0;
      local_3c8.m_data[2] = 0.0;
      local_3b8.m_data[0] = 0.0;
      local_3b8.m_data[1] = 0.0;
      local_3b8.m_data[2] = 0.0;
      local_3b8.m_data[3] = 0.0;
      local_3c8.m_data[3] = 0.0;
      local_3a8.m_data[0] = local_3c8.m_data[0];
      deqp::gls::AttribSpec::AttribSpec
                (&local_380,"a_bound",&local_398,&local_3a8,&local_3b8,&local_3c8);
      std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
      emplace_back<deqp::gls::AttribSpec>
                (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
                 &local_380);
    }
    std::__cxx11::string::~string((string *)&local_380);
  }
LAB_003e5489:
  local_398.m_data[0] = 0.0;
  local_398.m_data[1] = 0.1;
  local_398.m_data[2] = 0.2;
  local_398.m_data[3] = 0.3;
  local_3a8.m_data[0] = 0.4;
  local_3a8.m_data[1] = 0.5;
  local_3a8.m_data[2] = 0.6;
  local_3a8.m_data[3] = 0.7;
  local_3b8.m_data[0] = 0.8;
  local_3b8.m_data[1] = 0.9;
  local_3b8.m_data[2] = 1.0;
  local_3b8.m_data[3] = 1.1;
  local_3c8.m_data[0] = 1.2;
  local_3c8.m_data[1] = 1.3;
  local_3c8.m_data[2] = 1.4;
  local_3c8.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&local_380,"a_value",&local_398,&local_3a8,&local_3b8,&local_3c8);
  __args = &local_380;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__args);
  std::__cxx11::string::~string((string *)&local_380);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__args);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  iVar4 = std::__cxx11::ostringstream::~ostringstream(local_320);
  return iVar4;
}

Assistant:

void LoopCase::init (void)
{
	bool				isVertexCase	= m_caseType == CASETYPE_VERTEX;

	bool				isStaticCase	= m_decisionType == DECISION_STATIC;
	bool				isUniformCase	= m_decisionType == DECISION_UNIFORM;
	bool				isAttributeCase	= m_decisionType == DECISION_ATTRIBUTE;

	DE_ASSERT(isStaticCase || isUniformCase || isAttributeCase);

	DE_ASSERT(m_type == LOOP_FOR		||
			  m_type == LOOP_WHILE		||
			  m_type == LOOP_DO_WHILE);

	DE_ASSERT(isAttributeCase || m_isLoopBoundStable); // The loop bound count can vary between executions only if using attribute input.

	// \note The fractional part is .5 (instead of .0) so that these can be safely used as loop bounds.
	const float			loopBound				= 10.5f;
	const float			unstableBoundLow		= 5.5f;
	const float			unstableBoundHigh		= 15.5f;
	static const char*	loopBoundStr			= "10.5";
	static const char*	unstableBoundLowStr		= "5.5";
	static const char*	unstableBoundHighStr	= "15.5";

	const char*			boundValueStr		= isStaticCase			? loopBoundStr :
											  isUniformCase			? "u_bound" :
											  isVertexCase			? "a_bound" :
											  m_isLoopBoundStable	? "v_bound" :
																	  "loopBound";

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";	// Position attribute.
	vtx << "attribute mediump vec4 a_value;\n";		// Input for workload calculations.

	// Value to be used as the loop iteration count.
	if (isAttributeCase)
		vtx << "attribute mediump float a_bound;\n";
	else if (isUniformCase)
		op << "uniform mediump float u_bound;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_value;\n";
		frag << "varying mediump vec4 v_value;\n";

		if (isAttributeCase)
		{
			vtx << "varying mediump float v_bound;\n";
			frag << "varying mediump float v_bound;\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "	mediump vec4 res = vec4(0.0);\n";

	if (!m_isLoopBoundStable && !isVertexCase)
	{
		// Choose the actual loop bound based on v_bound.
		// \note Loop bound will vary with high frequency between fragment columns, given appropriate range for v_bound.
		op << "	mediump float loopBound = fract(v_bound) < 0.5 ? " << unstableBoundLowStr << " : " << unstableBoundHighStr << ";\n";
	}

	// Start a for, while or do-while loop.
	if (m_type == LOOP_FOR)
		op << "	for (mediump float i = 0.0; i < " << boundValueStr << "; i++)\n";
	else
	{
		op << "	mediump float i = 0.0;\n";
		if (m_type == LOOP_WHILE)
			op << "	while (i < " << boundValueStr << ")\n";
		else // LOOP_DO_WHILE
			op << "	do\n";
	}
	op << "	{\n";

	// Workload calculations inside the loop.
	op << "\t\t";
	writeLoopWorkload(op, "res", isVertexCase ? "a_value" : "v_value");
	op << "\n";

	// Only "for" has counter increment in the loop head.
	if (m_type != LOOP_FOR)
		op << "		i++;\n";

	// End the loop.
	if (m_type == LOOP_DO_WHILE)
		op << "	} while (i < " << boundValueStr << ");\n";
	else
		op << "	}\n";

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		// Transfer inputs to fragment shader through varyings.
		if (isAttributeCase)
			vtx << "	v_bound = a_bound;\n";
		vtx << "	v_value = a_value;\n";

		frag << "	gl_FragColor = res;\n"; // Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	if (isAttributeCase)
	{
		if (m_isLoopBoundStable)
		{
			// Every execution has same number of iterations.

			m_attributes.push_back(AttribSpec("a_bound",	Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f),
															Vec4(loopBound, 0.0f, 0.0f, 0.0f)));
		}
		else if (isVertexCase)
		{
			// Vertex case, with non-constant number of iterations.

			const int	numComponents	= 4;
			int			numVertices		= (getGridWidth() + 1) * (getGridHeight() + 1);

			// setupProgram() will later bind this array as an attribute.
			m_boundArray.resize(numVertices * numComponents);

			// Vary between low and high loop bounds; they should average to loopBound however.
			for (int i = 0; i < (int)m_boundArray.size(); i++)
			{
				if (i % numComponents == 0)
					m_boundArray[i] = (i / numComponents) % 2 == 0 ? unstableBoundLow : unstableBoundHigh;
				else
					m_boundArray[i] = 0.0f;
			}
		}
		else // !m_isLoopBoundStable && !isVertexCase
		{
			// Fragment case, with non-constant number of iterations.
			// \note fract(a_bound) < 0.5 will be true for every second fragment.

			float minValue = 0.0f;
			float maxValue = (float)getViewportWidth()*0.5f;
			m_attributes.push_back(AttribSpec("a_bound",	Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f),
															Vec4(minValue, 0.0f, 0.0f, 0.0f),
															Vec4(maxValue, 0.0f, 0.0f, 0.0f)));
		}
	}

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}